

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmintegration.cpp
# Opt level: O2

EGLDisplay __thiscall
QEglFSKmsGbmIntegration::createDisplay
          (QEglFSKmsGbmIntegration *this,EGLNativeDisplayType nativeDisplay)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  code *pcVar4;
  EGLDisplay pvVar5;
  long in_FS_OFFSET;
  char local_38 [24];
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = QtPrivateLogging::qLcEglfsKmsDebug();
  if ((*(byte *)(lVar1 + 0x10) & 1) != 0) {
    local_20 = *(undefined8 *)(lVar1 + 8);
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    QMessageLogger::debug(local_38,"Querying EGLDisplay");
  }
  pcVar2 = (char *)eglQueryString(0,0x3055);
  if (pcVar2 != (char *)0x0) {
    pcVar3 = strstr(pcVar2,"EGL_KHR_platform_gbm");
    if (pcVar3 == (char *)0x0) {
      pcVar2 = strstr(pcVar2,"EGL_MESA_platform_gbm");
      if (pcVar2 == (char *)0x0) goto LAB_001117f0;
    }
    pcVar4 = (code *)eglGetProcAddress("eglGetPlatformDisplayEXT");
    if (pcVar4 != (code *)0x0) {
      pvVar5 = (EGLDisplay)(*pcVar4)(0x31d7,nativeDisplay,0);
      goto LAB_0011182f;
    }
  }
LAB_001117f0:
  lVar1 = QtPrivateLogging::qLcEglfsKmsDebug();
  if ((*(byte *)(lVar1 + 0x10) & 1) != 0) {
    local_20 = *(undefined8 *)(lVar1 + 8);
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    QMessageLogger::debug
              (local_38,"No eglGetPlatformDisplay for GBM, falling back to eglGetDisplay");
  }
  pvVar5 = (EGLDisplay)eglGetDisplay(nativeDisplay);
LAB_0011182f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pvVar5;
  }
  __stack_chk_fail();
}

Assistant:

EGLDisplay QEglFSKmsGbmIntegration::createDisplay(EGLNativeDisplayType nativeDisplay)
{
    qCDebug(qLcEglfsKmsDebug, "Querying EGLDisplay");
    EGLDisplay display;

    PFNEGLGETPLATFORMDISPLAYEXTPROC getPlatformDisplay = nullptr;
    const char *extensions = eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
    if (extensions && (strstr(extensions, "EGL_KHR_platform_gbm") || strstr(extensions, "EGL_MESA_platform_gbm"))) {
        getPlatformDisplay = reinterpret_cast<PFNEGLGETPLATFORMDISPLAYEXTPROC>(
            eglGetProcAddress("eglGetPlatformDisplayEXT"));
    }

    if (getPlatformDisplay) {
        display = getPlatformDisplay(EGL_PLATFORM_GBM_KHR, nativeDisplay, nullptr);
    } else {
        qCDebug(qLcEglfsKmsDebug, "No eglGetPlatformDisplay for GBM, falling back to eglGetDisplay");
        display = eglGetDisplay(nativeDisplay);
    }

    return display;
}